

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O0

NeuralNetwork * addSoftmaxLayer(Model *m,char *name,char *input,char *output)

{
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  NeuralNetworkLayer *softmaxLayer;
  NeuralNetwork *neuralNet;
  char *output_local;
  char *input_local;
  char *name_local;
  Model *m_local;
  
  this = CoreML::Specification::Model::mutable_neuralnetwork(m);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::set_name(this_00,name);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,input);
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,output);
  CoreML::Specification::NeuralNetworkLayer::mutable_softmax(this_00);
  return this;
}

Assistant:

Specification::NeuralNetwork* addSoftmaxLayer(Specification::Model& m, const char *name,  const char *input, const char *output) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto softmaxLayer = neuralNet->add_layers();
    
    softmaxLayer->set_name(name);
    softmaxLayer->add_input(input);
    softmaxLayer->add_output(output);
    softmaxLayer->mutable_softmax();
    
    return neuralNet;
}